

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUCS4Transcoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XMLUCS4Transcoder::transcodeFrom
          (XMLUCS4Transcoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  XMLCh ch2;
  XMLCh ch1;
  XMLInt32 LEAD_OFFSET;
  UCS4Ch nextVal;
  uchar *sizePtr;
  XMLCh *outEnd;
  XMLCh *outPtr;
  UCS4Ch *srcEnd;
  UCS4Ch *srcPtr;
  XMLSize_t *bytesEaten_local;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  XMLSize_t srcCount_local;
  XMLByte *srcData_local;
  XMLUCS4Transcoder *this_local;
  
  _LEAD_OFFSET = charSizes;
  outEnd = toFill;
  for (srcEnd = (UCS4Ch *)srcData;
      outEnd < toFill + maxChars && srcEnd < srcData + (srcCount & 0xfffffffffffffffc);
      srcEnd = srcEnd + 1) {
    _ch2 = *srcEnd;
    if ((this->fSwapped & 1U) != 0) {
      _ch2 = BitOps::swapBytes(_ch2);
    }
    if ((_ch2 & 0xffff0000U) == 0) {
      *_LEAD_OFFSET = '\x04';
      *outEnd = (XMLCh)_ch2;
      _LEAD_OFFSET = _LEAD_OFFSET + 1;
      outEnd = outEnd + 1;
    }
    else {
      if (outEnd + 1 == toFill + maxChars) break;
      *_LEAD_OFFSET = '\x04';
      *outEnd = (short)((uint)_ch2 >> 10) + L'ퟀ';
      _LEAD_OFFSET[1] = '\0';
      outEnd[1] = ((XMLCh)_ch2 & 0x3ffU) + L'\xdc00';
      _LEAD_OFFSET = _LEAD_OFFSET + 2;
      outEnd = outEnd + 2;
    }
  }
  *bytesEaten = (long)srcEnd - (long)srcData;
  return (long)outEnd - (long)toFill >> 1;
}

Assistant:

XMLSize_t
XMLUCS4Transcoder::transcodeFrom(const  XMLByte* const          srcData
                                , const XMLSize_t               srcCount
                                ,       XMLCh* const            toFill
                                , const XMLSize_t               maxChars
                                ,       XMLSize_t&              bytesEaten
                                ,       unsigned char* const    charSizes)
{
    //
    //  Get pointers to the start and end of the source buffer in terms of
    //  UCS-4 characters.
    //
    const UCS4Ch*   srcPtr = reinterpret_cast<const UCS4Ch*>(srcData);
    const UCS4Ch*   srcEnd = srcPtr + (srcCount / sizeof(UCS4Ch));

    //
    //  Get pointers to the start and end of the target buffer, which is
    //  in terms of the XMLCh chars we output.
    //
    XMLCh*  outPtr = toFill;
    XMLCh*  outEnd = toFill + maxChars;

    //
    //  And get a pointer into the char sizes buffer. We will run this
    //  up as we put chars into the output buffer.
    //
    unsigned char* sizePtr = charSizes;

    //
    //  Now process chars until we either use up all our source or all of
    //  our output space.
    //
    while ((outPtr < outEnd) && (srcPtr < srcEnd))
    {
        //
        //  Get the next UCS char out of the buffer. Don't bump the ptr
        //  yet since we might not have enough storage for it in the target
        //  (if its causes a surrogate pair to be created.
        //
        UCS4Ch nextVal = *srcPtr;

        // If it needs to be swapped, then do it
        if (fSwapped)
            nextVal = BitOps::swapBytes(nextVal);

        // Handle a surrogate pair if needed
        if (nextVal & 0xFFFF0000)
        {
            //
            //  If we don't have room for both of the chars, then we
            //  bail out now.
            //
            if (outPtr + 1 == outEnd)
                break;

            const XMLInt32 LEAD_OFFSET = 0xD800 - (0x10000 >> 10);
	        const XMLCh ch1 = XMLCh(LEAD_OFFSET + (nextVal >> 10));
	        const XMLCh ch2 = XMLCh(0xDC00 + (nextVal & 0x3FF));

            //
            //  We have room so store them both. But note that the
            //  second one took up no source bytes!
            //
            *sizePtr++ = sizeof(UCS4Ch);
            *outPtr++ = ch1;
            *sizePtr++ = 0;
            *outPtr++ = ch2;
        }
         else
        {
            //
            //  No surrogate, so just store it and bump the count of chars
            //  read. Update the char sizes buffer for this char's entry.
            //
            *sizePtr++ = sizeof(UCS4Ch);
            *outPtr++ = XMLCh(nextVal);
        }

        // Indicate that we ate another UCS char's worth of bytes
        srcPtr++;
    }

    // Set the bytes eaten parameter
    bytesEaten = ((const XMLByte*)srcPtr) - srcData;

    // And return the chars written into the output buffer
    return outPtr - toFill;
}